

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

bool __thiscall
wallet::CWallet::WithEncryptionKey
          (CWallet *this,
          function<bool_(const_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_&)> cb)

{
  undefined1 uVar1;
  undefined8 uVar2;
  long in_RSI;
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  if (*(long *)(in_RSI + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      uVar2 = std::__throw_bad_function_call();
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        _Unwind_Resume(uVar2);
      }
    }
  }
  else {
    uVar1 = (**(code **)(in_RSI + 0x18))();
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return (bool)uVar1;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::WithEncryptionKey(std::function<bool (const CKeyingMaterial&)> cb) const
{
    LOCK(cs_wallet);
    return cb(vMasterKey);
}